

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddLCache.c
# Opt level: O2

int cuddHashTableInsert(DdHashTable *hash,DdNodePtr *key,DdNode *value,ptrint count)

{
  int *piVar1;
  DdHashItem **ppDVar2;
  uint uVar3;
  int iVar4;
  DdHashItem *pDVar5;
  ulong uVar6;
  
  if (hash->maxsize < hash->size) {
    cuddHashTableResize(hash);
  }
  pDVar5 = cuddHashTableAlloc(hash);
  if (pDVar5 == (DdHashItem *)0x0) {
    iVar4 = 0;
  }
  else {
    hash->size = hash->size + 1;
    pDVar5->value = value;
    piVar1 = (int *)(((ulong)value & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    pDVar5->count = count;
    uVar3 = hash->keysize;
    for (uVar6 = 0; uVar3 != uVar6; uVar6 = uVar6 + 1) {
      pDVar5->key[uVar6] = key[uVar6];
    }
    uVar3 = ddLCHash(key,uVar3,hash->shift);
    ppDVar2 = hash->bucket;
    pDVar5->next = ppDVar2[uVar3];
    ppDVar2[uVar3] = pDVar5;
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

int
cuddHashTableInsert(
  DdHashTable * hash,
  DdNodePtr * key,
  DdNode * value,
  ptrint count)
{
    int result;
    unsigned int posn;
    DdHashItem *item;
    unsigned int i;

#ifdef DD_DEBUG
    assert(hash->keysize > 3);
#endif

    if (hash->size > hash->maxsize) {
        result = cuddHashTableResize(hash);
        if (result == 0) return(0);
    }
    item = cuddHashTableAlloc(hash);
    if (item == NULL) return(0);
    hash->size++;
    item->value = value;
    cuddRef(value);
    item->count = count;
    for (i = 0; i < hash->keysize; i++) {
        item->key[i] = key[i];
    }
    posn = ddLCHash(key,hash->keysize,hash->shift);
    item->next = hash->bucket[posn];
    hash->bucket[posn] = item;

    return(1);

}